

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_poc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  int local_3c;
  jpc_pocpchg_t *pjStack_38;
  int pchgno;
  jpc_pocpchg_t *pchg;
  jpc_poc_t *poc;
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  local_3c = 0;
  pjStack_38 = (ms->parms).poc.pchgs;
  while( true ) {
    if ((ms->parms).soc <= local_3c) {
      return 0;
    }
    iVar1 = jpc_putuint8(out,pjStack_38->rlvlnostart);
    if (iVar1 != 0) {
      return -1;
    }
    if (cstate->numcomps < 0x101) {
      iVar1 = jpc_putuint8(out,(uint_fast8_t)pjStack_38->compnostart);
    }
    else {
      iVar1 = jpc_putuint16(out,pjStack_38->compnostart);
    }
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = jpc_putuint16(out,pjStack_38->lyrnoend);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = jpc_putuint8(out,pjStack_38->rlvlnoend);
    if (iVar1 != 0) break;
    if (cstate->numcomps < 0x101) {
      iVar1 = jpc_putuint8(out,(uint_fast8_t)pjStack_38->compnoend);
    }
    else {
      iVar1 = jpc_putuint16(out,pjStack_38->compnoend);
    }
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = jpc_putuint8(out,pjStack_38->prgord);
    if (iVar1 != 0) {
      return -1;
    }
    local_3c = local_3c + 1;
    pjStack_38 = pjStack_38 + 1;
  }
  return -1;
}

Assistant:

static int jpc_poc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs; ++pchgno,
	  ++pchg) {
		if (jpc_putuint8(out, pchg->rlvlnostart) ||
		  ((cstate->numcomps > 256) ?
		  jpc_putuint16(out, pchg->compnostart) :
		  jpc_putuint8(out, pchg->compnostart)) ||
		  jpc_putuint16(out, pchg->lyrnoend) ||
		  jpc_putuint8(out, pchg->rlvlnoend) ||
		  ((cstate->numcomps > 256) ?
		  jpc_putuint16(out, pchg->compnoend) :
		  jpc_putuint8(out, pchg->compnoend)) ||
		  jpc_putuint8(out, pchg->prgord)) {
			return -1;
		}
	}
	return 0;
}